

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon_maps.c
# Opt level: O3

void set_dungeon_tile(dw_rom *rom,dw_map_index town,uint8_t x,uint8_t y,uint8_t tile)

{
  dw_map_meta *pdVar1;
  byte *pbVar2;
  byte bVar3;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  ulong uVar4;
  long lVar5;
  
  pdVar1 = (rom->map).meta;
  if ((pdVar1[town].width < x) || (pdVar1[town].height < y)) {
    printf("Map index (%d, %d) out of bounds, skipping tile setting...\n",
           CONCAT71(in_register_00000011,x) & 0xffffffff,y);
    pdVar1 = (rom->map).meta;
    printf("Map: %d, Width: %d, Height: %d\n",(ulong)town,(ulong)pdVar1[town].width,
           (ulong)pdVar1[town].height);
    puts("This is a bug.");
    return;
  }
  uVar4 = (CONCAT71(in_register_00000011,x) & 0xffffffff) +
          ((ulong)pdVar1[town].width + 1) * (CONCAT71(in_register_00000009,y) & 0xffffffff);
  lVar5 = (uVar4 >> 1 & 0x7fffffff) + (ulong)(*(ushort *)pdVar1[town].pointer & 0x7fff);
  if (town < TANTEGEL_BASEMENT) {
    pbVar2 = rom->content + lVar5;
    bVar3 = rom->content[lVar5];
    if ((uVar4 & 1) != 0) {
      bVar3 = bVar3 & 0xf0;
LAB_00168470:
      *pbVar2 = bVar3;
      goto LAB_00168472;
    }
    bVar3 = bVar3 & 0xf;
  }
  else {
    if ((tile & 8) != 0) {
      printf("Invalid tile %d for map number %d\n",(ulong)tile,(ulong)town);
      puts("This is a bug.");
      tile = tile & 7;
    }
    pbVar2 = rom->content + lVar5;
    bVar3 = rom->content[lVar5];
    if ((uVar4 & 1) != 0) {
      bVar3 = bVar3 & 0xf8;
      goto LAB_00168470;
    }
    bVar3 = bVar3 & 0x8f;
  }
  *pbVar2 = bVar3;
  tile = tile << 4;
LAB_00168472:
  rom->content[lVar5] = rom->content[lVar5] | tile;
  return;
}

Assistant:

void set_dungeon_tile(dw_rom *rom, dw_map_index town, uint8_t x,
        uint8_t y, uint8_t tile)
{
    BOOL roof_data;
    uint8_t oldval;
    size_t offset = (size_t)y * (rom->map.meta[town].width+1) + x;
    size_t data_addr = ((*(uint16_t*)(&rom->map.meta[town].pointer)) & 0x7fff) +
        offset/2;

    if (x > rom->map.meta[town].width || y > rom->map.meta[town].height) {
        printf("Map index (%d, %d) out of bounds, skipping tile setting...\n",
                x, y);
        printf("Map: %d, Width: %d, Height: %d\n", town, 
                rom->map.meta[town].width, rom->map.meta[town].height);
        printf("This is a bug.\n");
        return;
    }

    /* Preserve the MSB for some maps, as they contain roof data for towns. */
    roof_data = contains_roof_data(town);
    if (roof_data && (tile & 8)) {
        printf("Invalid tile %d for map number %d\n", tile, town);
        printf("This is a bug.\n");
        tile &= 7;
    }
    oldval = rom->content[data_addr];
    if (offset % 2) {
        if (roof_data) {
            rom->content[data_addr] &= 0xf8;
        } else {
            rom->content[data_addr] &= 0xf0;
        }
        rom->content[data_addr] |= tile;
    } else {
        if (roof_data) {
            rom->content[data_addr] &= 0x8f;
        } else {
            rom->content[data_addr] &= 0x0f;
        }
        rom->content[data_addr] |= tile << 4;
    }
}